

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

bool IsLegalOpcodeForPathDepBrFold(Instr *instr)

{
  OpCode OVar1;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this;
  FunctionJITTimeInfo *this_00;
  bool bVar3;
  
  bVar2 = IR::Instr::IsRealInstr(instr);
  bVar3 = true;
  if (bVar2) {
    OVar1 = instr->m_opcode;
    if (OVar1 < Ld_I4) {
      if (OVar1 == Ld_A) {
        return true;
      }
      if (OVar1 == LdFld) {
        return true;
      }
    }
    else {
      if (OVar1 == Ld_I4) {
        return true;
      }
      if (OVar1 == ByteCodeUses) {
        return true;
      }
      if (OVar1 == InlineeEnd) {
        return true;
      }
    }
    this = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this);
    this_00 = JITTimeWorkItem::GetJITTimeInfo(instr->m_func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_00);
    bVar2 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015b6718,PathDepBranchFoldingPhase,sourceContextId,functionId)
    ;
    if ((bVar2) && (DAT_015bc46a == '\x01')) {
      bVar3 = false;
      Output::Print(L"Skipping PathDependentBranchFolding due to: ");
      IR::Instr::Dump(instr);
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

static bool IsLegalOpcodeForPathDepBrFold(IR::Instr *instr)
{
    if (!instr->IsRealInstr())
    {
        return true;
    }
    switch (instr->m_opcode)
    {
    case Js::OpCode::Ld_A:
    case Js::OpCode::Ld_I4:
    case Js::OpCode::LdFld:
    case Js::OpCode::ByteCodeUses:
    case Js::OpCode::InlineeEnd:
        return true;
    }
#if DBG
    if (PHASE_TRACE(Js::PathDepBranchFoldingPhase, instr->m_func) && Js::Configuration::Global.flags.Verbose)
    {
        Output::Print(_u("Skipping PathDependentBranchFolding due to: "));
        instr->Dump();
    }
#endif
    return false;
}